

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O0

void __thiscall
BMRS_XZ<UFPC>::PerformLabelingMem
          (BMRS_XZ<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  uint uVar4;
  int *piVar5;
  uchar *puVar6;
  uint *puVar7;
  reference pvVar8;
  double dVar9;
  int local_3e0;
  int local_3cc;
  Mat_<int> local_390;
  allocator<unsigned_long> local_329;
  value_type_conflict2 local_328;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_320;
  uint local_304;
  unsigned_short local_2fe;
  int label_1;
  unsigned_short end_pos_1;
  int k_2;
  int iStack_2f0;
  unsigned_short start_pos_1;
  int j_4;
  int i_3;
  int label;
  int iStack_2e0;
  unsigned_short end_pos;
  int k_1;
  int k;
  int iStack_2d4;
  unsigned_short start_pos;
  int j_3;
  int i_d;
  int i_u;
  int i_2;
  Run *runs;
  uint64_t d_shl;
  uint64_t d;
  uint64_t u_shl;
  uint64_t u;
  ulong uStack_298;
  int j_2;
  uint64_t d0;
  uint64_t u0;
  uint64_t *bits_dest;
  uint64_t *bits_d;
  uint64_t *bits_u;
  int i_1;
  int j_1;
  uint64_t *pdata_merged_1;
  uint64_t *pdata_source;
  uint64_t *puStack_250;
  int j;
  uint64_t *pdata_merged;
  uint64_t *pdata_source2;
  uint64_t *pdata_source1;
  int local_230;
  int i;
  int data_width;
  int h_merge;
  int h;
  int w;
  undefined1 local_218 [8];
  MemMat<int> img_labels;
  Mat_<unsigned_char> local_140;
  undefined1 local_e0 [8];
  MemMat<unsigned_char> img;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses_local;
  BMRS_XZ<UFPC> *this_local;
  
  img.accesses_._88_8_ = accesses;
  cv::Mat_<unsigned_char>::Mat_(&local_140,(this->super_Labeling2D<(Connectivity2D)8,_false>).img_);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_e0,&local_140);
  cv::Mat_<unsigned_char>::~Mat_(&local_140);
  cv::MatSize::operator()((MatSize *)&h);
  MemMat<int>::MemMat((MemMat<int> *)local_218,(Size *)&h,0);
  h_merge = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  data_width = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  Data_Compressed::Alloc(&this->data_compressed,data_width,h_merge);
  InitCompressedDataMem(this,&this->data_compressed,(MemMat<unsigned_char> *)local_e0);
  i = data_width / 2 + data_width % 2;
  local_230 = (this->data_compressed).data_width;
  Data_Compressed::Alloc(&this->data_merged,i,h_merge);
  for (pdata_source1._4_4_ = 0; pdata_source1._4_4_ < data_width / 2;
      pdata_source1._4_4_ = pdata_source1._4_4_ + 1) {
    pdata_source2 =
         Data_Compressed::operator[](&this->data_compressed,(long)(pdata_source1._4_4_ << 1));
    pdata_merged = Data_Compressed::operator[]
                             (&this->data_compressed,(long)(pdata_source1._4_4_ * 2 + 1));
    puStack_250 = Data_Compressed::operator[](&this->data_merged,(long)pdata_source1._4_4_);
    for (pdata_source._4_4_ = 0; pdata_source._4_4_ < local_230;
        pdata_source._4_4_ = pdata_source._4_4_ + 1) {
      puStack_250[pdata_source._4_4_] =
           pdata_source2[pdata_source._4_4_] | pdata_merged[pdata_source._4_4_];
    }
  }
  if (data_width % 2 != 0) {
    pdata_merged_1 = Data_Compressed::operator[](&this->data_compressed,(long)(data_width + -1));
    _i_1 = Data_Compressed::operator[](&this->data_merged,(long)(data_width / 2));
    for (bits_u._4_4_ = 0; bits_u._4_4_ < local_230; bits_u._4_4_ = bits_u._4_4_ + 1) {
      _i_1[bits_u._4_4_] = pdata_merged_1[bits_u._4_4_];
    }
  }
  Data_Compressed::Alloc(&this->data_flags,i + -1,h_merge);
  for (bits_u._0_4_ = 0; (int)bits_u < (this->data_flags).height; bits_u._0_4_ = (int)bits_u + 1) {
    bits_d = Data_Compressed::operator[](&this->data_compressed,(long)((int)bits_u * 2 + 1));
    bits_dest = Data_Compressed::operator[](&this->data_compressed,(long)((int)bits_u * 2 + 2));
    u0 = (uint64_t)Data_Compressed::operator[](&this->data_flags,(long)(int)bits_u);
    d0 = *bits_d;
    uStack_298 = *bits_dest;
    *(uint64_t *)u0 = (d0 | d0 << 1) & (uStack_298 | uStack_298 << 1);
    for (u._4_4_ = 1; u._4_4_ < local_230; u._4_4_ = u._4_4_ + 1) {
      u_shl = bits_d[u._4_4_];
      d = u_shl << 1;
      d_shl = bits_dest[u._4_4_];
      runs = (Run *)(d_shl << 1);
      if ((bits_d[u._4_4_ + -1] & 0x8000000000000000) != 0) {
        d = d | 1;
      }
      if ((bits_dest[u._4_4_ + -1] & 0x8000000000000000) != 0) {
        runs = (Run *)((ulong)runs | 1);
      }
      *(uint64_t *)(u0 + (long)u._4_4_ * 8) = (u_shl | d) & (d_shl | (ulong)runs);
    }
  }
  Runs::Alloc(&this->data_runs,data_width,h_merge);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  UFPC::MemAlloc(((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) * ((iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1)
                 + 1);
  UFPC::MemSetup();
  FindRunsMem(this,(this->data_merged).bits,(this->data_flags).bits,i,local_230,
              (this->data_runs).runs);
  _i_u = (this->data_runs).runs;
  for (i_d = 0; i_d < data_width / 2; i_d = i_d + 1) {
    j_3 = i_d * 2;
    iStack_2d4 = j_3 + 1;
    k = 0;
    for (; k_1._2_2_ = _i_u->start_pos, k_1._2_2_ != 0xffff; _i_u = _i_u + 1) {
      i_3._2_2_ = _i_u->end_pos;
      j_4 = UFPC::MemGetLabel(_i_u->label);
      for (; k < (int)(uint)k_1._2_2_; k = k + 1) {
        piVar5 = MemMat<int>::operator()((MemMat<int> *)local_218,j_3,k);
        *piVar5 = 0;
        piVar5 = MemMat<int>::operator()((MemMat<int> *)local_218,iStack_2d4,k);
        *piVar5 = 0;
      }
      for (; k < (int)(uint)i_3._2_2_; k = k + 1) {
        puVar6 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,j_3,k);
        if (*puVar6 == '\0') {
          local_3cc = 0;
        }
        else {
          local_3cc = j_4;
        }
        piVar5 = MemMat<int>::operator()((MemMat<int> *)local_218,j_3,k);
        *piVar5 = local_3cc;
        puVar6 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,iStack_2d4,k);
        if (*puVar6 == '\0') {
          local_3e0 = 0;
        }
        else {
          local_3e0 = j_4;
        }
        piVar5 = MemMat<int>::operator()((MemMat<int> *)local_218,iStack_2d4,k);
        *piVar5 = local_3e0;
      }
    }
    k_1._2_2_ = 0xffff;
    for (iStack_2e0 = k; iStack_2e0 < h_merge; iStack_2e0 = iStack_2e0 + 1) {
      piVar5 = MemMat<int>::operator()((MemMat<int> *)local_218,j_3,iStack_2e0);
      *piVar5 = 0;
    }
    for (label = k; label < h_merge; label = label + 1) {
      piVar5 = MemMat<int>::operator()((MemMat<int> *)local_218,iStack_2d4,label);
      *piVar5 = 0;
    }
    _i_u = _i_u + 1;
  }
  if (data_width % 2 != 0) {
    iStack_2f0 = data_width + -1;
    k_2 = 0;
    for (; end_pos_1 = _i_u->start_pos, end_pos_1 != 0xffff; _i_u = _i_u + 1) {
      local_2fe = _i_u->end_pos;
      local_304 = UFPC::MemGetLabel(_i_u->label);
      for (; k_2 < (int)(uint)end_pos_1; k_2 = k_2 + 1) {
        piVar5 = MemMat<int>::operator()((MemMat<int> *)local_218,iStack_2f0,k_2);
        *piVar5 = 0;
      }
      for (k_2 = (int)end_pos_1; uVar4 = local_304, k_2 < (int)(uint)local_2fe; k_2 = k_2 + 1) {
        puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,iStack_2f0,k_2);
        *puVar7 = uVar4;
      }
    }
    end_pos_1 = 0xffff;
    for (label_1 = k_2; label_1 < h_merge; label_1 = label_1 + 1) {
      piVar5 = MemMat<int>::operator()((MemMat<int> *)local_218,iStack_2f0,k_2);
      *piVar5 = 0;
    }
  }
  local_328 = 0;
  std::allocator<unsigned_long>::allocator(&local_329);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_320,4,&local_328,&local_329);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
             &local_320);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_320);
  std::allocator<unsigned_long>::~allocator(&local_329);
  dVar9 = MemMat<unsigned_char>::GetTotalAccesses((MemMat<unsigned_char> *)local_e0);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
                      0);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  dVar9 = MemMat<int>::GetTotalAccesses((MemMat<int> *)local_218);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
                      1);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  dVar9 = UFPC::MemTotalAccesses();
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
                      2);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  MemMat<int>::GetImage(&local_390,(MemMat<int> *)local_218);
  cv::Mat_<int>::operator=
            ((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_390);
  cv::Mat_<int>::~Mat_(&local_390);
  UFPC::MemDealloc();
  Runs::Dealloc(&this->data_runs);
  Data_Compressed::Dealloc(&this->data_flags);
  Data_Compressed::Dealloc(&this->data_merged);
  Data_Compressed::Dealloc(&this->data_compressed);
  MemMat<int>::~MemMat((MemMat<int> *)local_218);
  MemMat<unsigned_char>::~MemMat((MemMat<unsigned_char> *)local_e0);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedDataMem(data_compressed, img);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        data_merged.Alloc(h_merge, w);
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        data_flags.Alloc(h_merge - 1, w);
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();
        FindRunsMem(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            int i_u = 2 * i;
            int i_d = i_u + 1;

            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) img_labels(i_u, k) = 0;
                    for (int k = j; k < w; k++) img_labels(i_d, k) = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);

                for (; j < start_pos; j++) img_labels(i_u, j) = 0, img_labels(i_d, j) = 0;
                for (; j < end_pos; j++) {
                    img_labels(i_u, j) = img(i_u, j) ? label : 0;
                    img_labels(i_d, j) = img(i_d, j) ? label : 0;
                }
            }
        }
        if (h % 2) {
            int i = h - 1;
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) img_labels(i, j) = 0;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);
                for (; j < start_pos; j++) img_labels(i, j) = 0;
                for (j = start_pos; j < end_pos; j++) img_labels(i, j) = label;
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
        data_runs.Dealloc();
        data_flags.Dealloc();
        data_merged.Dealloc();
        data_compressed.Dealloc();
    }